

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *method,Reader *replacement)

{
  bool bVar1;
  Fault local_120;
  Fault f_1;
  uint64_t local_110;
  DebugExpression<unsigned_long> local_108;
  undefined1 local_100 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  Fault local_d0;
  Fault f;
  uint64_t local_b0;
  DebugExpression<unsigned_long> local_a8;
  undefined1 local_a0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:919:5)>
  _kjContext919;
  anon_class_8_1_60e9c21f _kjContextFunc919;
  Reader *replacement_local;
  Reader *method_local;
  CompatibilityChecker *this_local;
  
  _kjContext919.func = (anon_class_8_1_60e9c21f *)method;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:919:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:919:5)>
                 *)&_kjCondition.result,(anon_class_8_1_60e9c21f *)&_kjContext919.func);
  local_b0 = capnp::schema::Method::Reader::getParamStructType(method);
  local_a8 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b0);
  f.exception = (Exception *)capnp::schema::Method::Reader::getParamStructType(replacement);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_a0,&local_a8,(unsigned_long *)&f
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (bVar1) {
    local_110 = capnp::schema::Method::Reader::getResultStructType(method);
    local_108 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_110);
    f_1.exception = (Exception *)capnp::schema::Method::Reader::getResultStructType(replacement);
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_unsigned_long> *)local_100,&local_108,
               (unsigned_long *)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_100);
    if (bVar1) {
      _kjCondition_1._36_4_ = 0;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[38]>
                (&local_120,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x39d,FAILED,"method.getResultStructType() == replacement.getResultStructType()",
                 "_kjCondition,\"Updated method has different results.\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)local_100,
                 (char (*) [38])"Updated method has different results.");
      this->compatibility = INCOMPATIBLE;
      _kjCondition_1._36_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_120);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[41]>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x39b,FAILED,"method.getParamStructType() == replacement.getParamStructType()",
               "_kjCondition,\"Updated method has different parameters.\"",
               (DebugComparison<unsigned_long,_unsigned_long> *)local_a0,
               (char (*) [41])"Updated method has different parameters.");
    this->compatibility = INCOMPATIBLE;
    _kjCondition_1._36_4_ = 1;
    kj::_::Debug::Fault::~Fault(&local_d0);
  }
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:919:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:919:5)>
                  *)&_kjCondition.result);
  return;
}

Assistant:

void checkCompatibility(const schema::Method::Reader& method,
                          const schema::Method::Reader& replacement) {
    KJ_CONTEXT("comparing method", method.getName());

    // TODO(someday):  Allow named parameter list to be replaced by compatible struct type.
    VALIDATE_SCHEMA(method.getParamStructType() == replacement.getParamStructType(),
                    "Updated method has different parameters.");
    VALIDATE_SCHEMA(method.getResultStructType() == replacement.getResultStructType(),
                    "Updated method has different results.");
  }